

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.h
# Opt level: O1

void __thiscall glslang::TInputScanner::advance(TInputScanner *this)

{
  int iVar1;
  int iVar2;
  size_t *psVar3;
  TSourceLoc *pTVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  int *piVar9;
  
  psVar3 = this->lengths;
  uVar5 = this->currentChar + 1;
  this->currentChar = uVar5;
  iVar1 = this->currentSource;
  if (psVar3[iVar1] <= uVar5) {
    iVar8 = iVar1 + 1;
    this->currentSource = iVar8;
    iVar2 = this->numSources;
    if (iVar8 < iVar2) {
      pTVar4 = this->loc;
      pTVar4[iVar8].string = pTVar4[iVar1].string + 1;
      pTVar4[iVar8].line = 1;
      pTVar4[iVar8].column = 0;
    }
    iVar1 = this->currentSource;
    if (iVar1 < iVar2) {
      piVar9 = &this->loc[(long)iVar1 + 1].column;
      lVar7 = (long)iVar1;
      do {
        lVar6 = lVar7 + 1;
        if (psVar3[lVar7] != 0) break;
        this->currentSource = (int)lVar6;
        if (lVar6 < iVar2) {
          piVar9[-2] = piVar9[-8] + 1;
          *(undefined8 *)(piVar9 + -1) = 1;
        }
        piVar9 = piVar9 + 6;
        lVar7 = lVar6;
      } while (lVar6 != iVar2);
    }
    this->currentChar = 0;
  }
  return;
}

Assistant:

void advance()
    {
        ++currentChar;
        if (currentChar >= lengths[currentSource]) {
            ++currentSource;
            if (currentSource < numSources) {
                loc[currentSource].string = loc[currentSource - 1].string + 1;
                loc[currentSource].line = 1;
                loc[currentSource].column = 0;
            }
            while (currentSource < numSources && lengths[currentSource] == 0) {
                ++currentSource;
                if (currentSource < numSources) {
                    loc[currentSource].string = loc[currentSource - 1].string + 1;
                    loc[currentSource].line = 1;
                    loc[currentSource].column = 0;
                }
            }
            currentChar = 0;
        }
    }